

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

ssize_t __thiscall higan::Buffer::ReadFromFd(Buffer *this,int fd)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  char acStack_10038 [8];
  char exbuffer [65535];
  iovec iovec_temp [2];
  
  register0x00000008 =
       (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start + this->write_idx_;
  pcVar4 = (pointer)readv(fd,(iovec *)(exbuffer + 0xfff8),
                          ((ulong)((long)(this->buffer_).
                                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)register0x00000008) < 0xffff) + 1);
  if ((long)pcVar4 < 0) {
    pcVar4 = (pointer)0xffffffffffffffff;
  }
  else {
    pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = this->write_idx_;
    pcVar6 = pcVar2 + (-(long)pcVar1 - sVar3);
    if (pcVar4 < pcVar6 || (long)pcVar4 - (long)pcVar6 == 0) {
      pcVar6 = pcVar2 + -(long)pcVar1;
      if (pcVar4 + sVar3 < pcVar2 + -(long)pcVar1) {
        pcVar6 = pcVar4 + sVar3;
      }
      this->write_idx_ = (size_t)pcVar6;
    }
    else {
      pcVar5 = pcVar2 + -(long)pcVar1;
      if (pcVar6 + sVar3 < pcVar2 + -(long)pcVar1) {
        pcVar5 = pcVar6 + sVar3;
      }
      this->write_idx_ = (size_t)pcVar5;
      CopyExDataToBuffer(this,acStack_10038,(long)pcVar4 - (long)pcVar6);
    }
  }
  return (ssize_t)pcVar4;
}

Assistant:

ssize_t Buffer::ReadFromFd(int fd)
{
	char exbuffer[MAX_EX_BUFFER_SIZE];

	iovec iovec_temp[2]{};
	iovec_temp[0].iov_base = WriteBegin();
	iovec_temp[0].iov_len = WritableSize();
	iovec_temp[1].iov_base = exbuffer;
	iovec_temp[1].iov_len = MAX_EX_BUFFER_SIZE;

	int iov_count = WritableSize() >= MAX_EX_BUFFER_SIZE ? 1 : 2;
	ssize_t read_size = readv(fd, iovec_temp, iov_count);

	if (read_size < 0)
	{
		return -1;
	}
	else if (static_cast<size_t>(read_size) <= WritableSize())
	{
		AddWriteIndex(read_size);
	}
	else
	{
		/**
		 * 先处理读入buffer_部分的数据 再处理exbuff中的内容
		 */
		ssize_t ex_len = read_size - WritableSize();
		AddWriteIndex(WritableSize());
		CopyExDataToBuffer(exbuffer, ex_len);
	}

	return read_size;
}